

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O3

graphProperties *
floorplan::GraphFileOperations::loadGraphFromXML
          (graphProperties *__return_storage_ptr__,string *filenamePath,floorplanGraph *outGraph,
          string *rootNodeName)

{
  size_t *psVar1;
  long *plVar2;
  pointer pcVar3;
  boost *this;
  vertex_descriptor u;
  size_type sVar4;
  size_type sVar5;
  _List_node_base **this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  self_type *psVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  mapped_type *ppvVar14;
  const_iterator cVar15;
  boost *pbVar16;
  ulong uVar17;
  Point2D *pPVar18;
  size_type __n;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar19;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar20;
  undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>
  *in_R9;
  OutEdgeList *el;
  ulong uVar21;
  undefined8 *puVar22;
  _Rb_tree_header *p_Var23;
  pair<bool,_void_*> pVar24;
  LineSegment lsegment;
  char *endptr;
  string spaceName;
  string spaceType;
  graphProperties *currentGraphProperty;
  vector<Point2D,_std::allocator<Point2D>_> points;
  adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
  *g;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  nameToVertex;
  ptree XMLtree;
  LineSegment local_668;
  char *local_608;
  string local_600;
  string local_5e0;
  graphProperties *local_5c0;
  vector<Point2D,_std::allocator<Point2D>_> local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_5a0;
  floorplanGraph *local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_590;
  undefined8 *local_588;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_580;
  string local_578;
  string *local_558;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  StoredVertexList *local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3e0;
  _List_node_base **local_3d8;
  Point2D local_3d0;
  string local_3c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  local_3a0;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  
  local_370.m_data._M_dataplus._M_p = (pointer)&local_370.m_data.field_2;
  local_370.m_data._M_string_length = 0;
  local_370.m_data.field_2._M_local_buf[0] = '\0';
  local_5c0 = __return_storage_ptr__;
  local_598 = outGraph;
  local_558 = rootNodeName;
  pvVar8 = operator_new(0x20);
  pvVar9 = operator_new(0x70);
  *(void **)((long)pvVar8 + 8) = pvVar9;
  *(undefined8 *)((long)pvVar9 + 0x48) = 0;
  *(long *)((long)pvVar9 + 0x50) = (long)pvVar9 + 0x48;
  *(long *)((long)pvVar9 + 0x58) = (long)pvVar9 + 0x48;
  *(long *)((long)pvVar9 + 0x68) = (long)pvVar9 + 0x60;
  *(long *)((long)pvVar9 + 0x60) = (long)pvVar9 + 0x60;
  *(undefined8 *)((long)pvVar8 + 0x18) = 0;
  local_370.m_children = pvVar8;
  std::locale::locale((locale *)&local_668);
  boost::property_tree::xml_parser::
  read_xml<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filenamePath,&local_370,0,(locale *)&local_668);
  std::locale::~locale((locale *)&local_668);
  local_3a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3a0._M_impl.super__Rb_tree_header._M_header;
  local_3a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3f0 = &(local_5c0->floorname).field_2;
  (local_5c0->floorname)._M_dataplus._M_p = (pointer)local_3f0;
  (local_5c0->floorname)._M_string_length = 0;
  (local_5c0->floorname).field_2._M_local_buf[0] = '\0';
  (local_5c0->filepath)._M_dataplus._M_p = (pointer)&(local_5c0->filepath).field_2;
  (local_5c0->filepath)._M_string_length = 0;
  (local_5c0->filepath).field_2._M_local_buf[0] = '\0';
  (local_5c0->centroid).x = -1.0;
  (local_5c0->centroid).y = -1.0;
  local_5c0->maxx = -1.0;
  local_5c0->maxy = -1.0;
  local_5c0->minx = -1.0;
  local_5c0->miny = -1.0;
  local_3a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3a0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&local_5c0->filepath);
  lVar10 = std::__cxx11::string::rfind((char)filenamePath,0x2f);
  if (lVar10 == -1) {
    std::__cxx11::string::_M_assign((string *)local_5c0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_668,(ulong)filenamePath);
    std::__cxx11::string::operator=((string *)local_5c0,(string *)&local_668);
    if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
      operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,(local_558->_M_dataplus)._M_p,(allocator<char> *)&local_600);
  local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
  local_668.type._M_string_length = (size_type)local_668.startPos.x;
  psVar11 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&local_370,(path_type *)&local_668);
  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
    operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
  }
  ppVar19 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              **)((long)psVar11->m_children + 8);
  pcVar3 = ppVar19[1].second.m_data._M_dataplus._M_p;
  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(pcVar3 + -0x60);
  if (pcVar3 == (pointer)0x0) {
    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0;
  }
  if (ppVar20 != ppVar19) {
    local_3e8 = &(local_598->super_type).m_vertices;
    local_3e0 = ppVar19;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                 (allocator<char> *)&local_600);
      iVar7 = std::__cxx11::string::compare((char *)&local_668);
      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
      }
      if (iVar7 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_78,ppVar20);
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"name","");
        GetAttr(&local_600,&local_78,&local_410);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_78.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
          operator_delete(local_78.first._M_dataplus._M_p,
                          local_78.first.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_c0,ppVar20);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"type","");
        GetAttr(&local_5e0,&local_c0,&local_430);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_c0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.first._M_dataplus._M_p != &local_c0.first.field_2) {
          operator_delete(local_c0.first._M_dataplus._M_p,
                          local_c0.first.field_2._M_allocated_capacity + 1);
        }
        lVar10 = std::__cxx11::string::find('\0',0x2e);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_600);
          std::__cxx11::string::operator=((string *)&local_600,(string *)&local_668);
          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
            operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
          }
        }
        local_5a0 = ppVar20;
        if (local_600._M_string_length != 0) {
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_600._M_dataplus._M_p,
                     local_600._M_dataplus._M_p + local_600._M_string_length);
          pVar24 = GraphUtils::doesVertexExists(&local_3c0,local_598);
          p_Var12 = (_List_node_base *)pVar24.second;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            p_Var12 = (_List_node_base *)operator_new(0xa8);
            p_Var12->_M_prev = p_Var12;
            p_Var12->_M_next = p_Var12;
            p_Var12[1]._M_next = (_List_node_base *)0x0;
            p_Var12[1]._M_prev = (_List_node_base *)&p_Var12[2]._M_prev;
            p_Var12[2]._M_next = (_List_node_base *)0x0;
            *(undefined1 *)&p_Var12[2]._M_prev = 0;
            p_Var12[3]._M_prev = (_List_node_base *)&p_Var12[4]._M_prev;
            p_Var12[4]._M_next = (_List_node_base *)0x0;
            *(undefined1 *)&p_Var12[4]._M_prev = 0;
            p_Var12[5]._M_prev = (_List_node_base *)0x0;
            p_Var12[6]._M_next = (_List_node_base *)0x0;
            p_Var12[6]._M_prev = (_List_node_base *)0x0;
            p_Var12[9]._M_next = (_List_node_base *)0xbff0000000000000;
            p_Var12[9]._M_prev = (_List_node_base *)0xbff0000000000000;
            p_Var12[10]._M_next = (_List_node_base *)0x0;
            p_Var13 = (_List_node_base *)operator_new(0x18);
            p_Var13[1]._M_next = p_Var12;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            psVar1 = &(local_598->super_type).m_vertices.
                      super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var12[10]._M_next =
                 (local_598->super_type).m_vertices.
                 super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
            std::__cxx11::string::_M_assign((string *)&p_Var12[1]._M_prev);
            std::__cxx11::string::_M_assign((string *)&p_Var12[3]._M_prev);
            ppvVar14 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                     *)&local_3a0,&local_600);
            *ppvVar14 = p_Var12;
          }
          local_590 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        **)((long)(local_5a0->second).m_children + 8);
          pcVar3 = local_590[1].second.m_data._M_dataplus._M_p;
          ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(pcVar3 + -0x60);
          if (pcVar3 == (pointer)0x0) {
            ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x0;
          }
          if (ppVar20 != local_590) {
            local_3d8 = &p_Var12[5]._M_prev;
            do {
              pPVar18 = &local_668.endPos;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                         (allocator<char> *)&local_578);
              iVar7 = std::__cxx11::string::compare((char *)&local_668);
              if ((Point2D *)local_668.startPos.x != pPVar18) {
                operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
              }
              if (iVar7 == 0) {
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_start = (Point2D *)0x0;
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_finish = (Point2D *)0x0;
                local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (Point2D *)0x0;
                local_580 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              **)((long)(ppVar20->second).m_children + 8);
                pcVar3 = local_580[1].second.m_data._M_dataplus._M_p;
                ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(pcVar3 + -0x60);
                if (pcVar3 == (pointer)0x0) {
                  ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)0x0;
                }
                if (ppVar19 != local_580) {
                  do {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar19->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_578);
                    iVar7 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != pPVar18) {
                      operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                    }
                    if (iVar7 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_108,ppVar19);
                      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"x","");
                      GetAttr((string *)&local_668,&local_108,&local_450);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[9]._M_next = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_450._M_dataplus._M_p != &local_450.field_2) {
                        operator_delete(local_450._M_dataplus._M_p,
                                        local_450.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_108.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_108.first._M_dataplus._M_p != &local_108.first.field_2) {
                        operator_delete(local_108.first._M_dataplus._M_p,
                                        local_108.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_150,ppVar19);
                      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"y","");
                      GetAttr((string *)&local_668,&local_150,&local_470);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[9]._M_prev = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_470._M_dataplus._M_p != &local_470.field_2) {
                        operator_delete(local_470._M_dataplus._M_p,
                                        local_470.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_150.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
                        operator_delete(local_150.first._M_dataplus._M_p,
                                        local_150.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar19->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_578);
                    iVar7 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != pPVar18) {
                      operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                    }
                    if (iVar7 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_198,ppVar19);
                      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_490,"maxx","");
                      GetAttr((string *)&local_668,&local_198,&local_490);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[7]._M_next = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_490._M_dataplus._M_p != &local_490.field_2) {
                        operator_delete(local_490._M_dataplus._M_p,
                                        local_490.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_198.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
                        operator_delete(local_198.first._M_dataplus._M_p,
                                        local_198.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_1e0,ppVar19);
                      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4b0,"maxy","");
                      GetAttr((string *)&local_668,&local_1e0,&local_4b0);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[7]._M_prev = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                        operator_delete(local_4b0._M_dataplus._M_p,
                                        local_4b0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_1e0.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e0.first._M_dataplus._M_p != &local_1e0.first.field_2) {
                        operator_delete(local_1e0.first._M_dataplus._M_p,
                                        local_1e0.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_228,ppVar19);
                      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4d0,"minx","");
                      GetAttr((string *)&local_668,&local_228,&local_4d0);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[8]._M_next = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                        operator_delete(local_4d0._M_dataplus._M_p,
                                        local_4d0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_228.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                        operator_delete(local_228.first._M_dataplus._M_p,
                                        local_228.first.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_270,ppVar19);
                      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_4f0,"miny","");
                      GetAttr((string *)&local_668,&local_270,&local_4f0);
                      p_Var13 = (_List_node_base *)strtod((char *)local_668.startPos.x,&local_608);
                      p_Var12[8]._M_prev = p_Var13;
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                        operator_delete(local_4f0._M_dataplus._M_p,
                                        local_4f0.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_270.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270.first._M_dataplus._M_p != &local_270.first.field_2) {
                        operator_delete(local_270.first._M_dataplus._M_p,
                                        local_270.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_668,(ppVar19->first)._M_dataplus._M_p,
                               (allocator<char> *)&local_578);
                    iVar7 = std::__cxx11::string::compare((char *)&local_668);
                    if ((Point2D *)local_668.startPos.x != pPVar18) {
                      operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                    }
                    if (iVar7 == 0) {
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_2b8,ppVar19);
                      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"x","");
                      GetAttr((string *)&local_668,&local_2b8,&local_510);
                      local_588 = (undefined8 *)strtod((char *)local_668.startPos.x,&local_608);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::pair(&local_300,ppVar19);
                      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"y","");
                      GetAttr(&local_578,&local_300,&local_530);
                      local_3d0.y = strtod(local_578._M_dataplus._M_p,&local_608);
                      local_3d0.x = (double)local_588;
                      if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<Point2D,_std::allocator<Point2D>_>::_M_realloc_insert<Point2D>
                                  (&local_5b8,
                                   (iterator)
                                   local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_3d0);
                      }
                      else {
                        (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                         super__Vector_impl_data._M_finish)->x = (double)local_588;
                        (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                         super__Vector_impl_data._M_finish)->y = local_3d0.y;
                        local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_578._M_dataplus._M_p != &local_578.field_2) {
                        operator_delete(local_578._M_dataplus._M_p,
                                        local_578.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_530._M_dataplus._M_p != &local_530.field_2) {
                        operator_delete(local_530._M_dataplus._M_p,
                                        local_530.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_300.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_300.first._M_dataplus._M_p != &local_300.first.field_2) {
                        operator_delete(local_300.first._M_dataplus._M_p,
                                        local_300.first.field_2._M_allocated_capacity + 1);
                      }
                      if ((Point2D *)local_668.startPos.x != pPVar18) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_510._M_dataplus._M_p != &local_510.field_2) {
                        operator_delete(local_510._M_dataplus._M_p,
                                        local_510.field_2._M_allocated_capacity + 1);
                      }
                      boost::property_tree::
                      basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~basic_ptree(&local_2b8.second);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b8.first._M_dataplus._M_p != &local_2b8.first.field_2) {
                        operator_delete(local_2b8.first._M_dataplus._M_p,
                                        local_2b8.first.field_2._M_allocated_capacity + 1);
                      }
                    }
                    pcVar3 = ppVar19[1].second.m_data._M_dataplus._M_p;
                    ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)(pcVar3 + -0x60);
                    if (pcVar3 == (pointer)0x0) {
                      ppVar19 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)0x0;
                    }
                  } while (ppVar19 != local_580);
                  if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    LineSegment::LineSegment(&local_668);
                    this_00 = local_3d8;
                    if ((long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                              _M_impl.super__Vector_impl_data._M_start != 0) {
                      uVar17 = (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      lVar10 = 0x10;
                      uVar21 = 0;
                      do {
                        plVar2 = (long *)((long)&local_5b8.
                                                 super__Vector_base<Point2D,_std::allocator<Point2D>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].x +
                                         lVar10);
                        local_668.startPos.x = (double)*plVar2;
                        local_668.startPos.y = (double)plVar2[1];
                        pPVar18 = (Point2D *)
                                  ((long)&(local_5b8.
                                           super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->x + lVar10);
                        if (uVar21 == uVar17 - 1) {
                          pPVar18 = local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                    _M_impl.super__Vector_impl_data._M_start;
                        }
                        local_668.endPos.x = pPVar18->x;
                        local_668.endPos.y = pPVar18->y;
                        std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back
                                  ((vector<LineSegment,_std::allocator<LineSegment>_> *)this_00,
                                   &local_668);
                        uVar21 = uVar21 + 1;
                        uVar17 = (long)local_5b8.
                                       super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                 (long)local_5b8.
                                       super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl
                                       .super__Vector_impl_data._M_start >> 4;
                        lVar10 = lVar10 + 0x10;
                      } while (uVar21 < uVar17);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_668.portalToRoom._M_dataplus._M_p !=
                        &local_668.portalToRoom.field_2) {
                      operator_delete(local_668.portalToRoom._M_dataplus._M_p,
                                      local_668.portalToRoom.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_668.type._M_dataplus._M_p._1_7_,
                                    local_668.type._M_dataplus._M_p._0_1_) !=
                        &local_668.type.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT71(local_668.type._M_dataplus._M_p._1_7_,
                                               local_668.type._M_dataplus._M_p._0_1_),
                                      local_668.type.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
                      super__Vector_impl_data._M_start != (Point2D *)0x0) {
                    operator_delete(local_5b8.super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_5b8.
                                          super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_5b8.
                                          super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
              pcVar3 = ppVar20[1].second.m_data._M_dataplus._M_p;
              ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(pcVar3 + -0x60);
              if (pcVar3 == (pointer)0x0) {
                ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x0;
              }
            } while (ppVar20 != local_590);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        ppVar19 = local_3e0;
        ppVar20 = local_5a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = ppVar20[1].second.m_data._M_dataplus._M_p;
      ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar3 + -0x60);
      if (pcVar3 == (pointer)0x0) {
        ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
      }
    } while (ppVar20 != ppVar19);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,(local_558->_M_dataplus)._M_p,(allocator<char> *)&local_600);
  local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
  local_668.type._M_string_length = (size_type)local_668.startPos.x;
  psVar11 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(&local_370,(path_type *)&local_668);
  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
    operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
  }
  ppVar19 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              **)((long)psVar11->m_children + 8);
  pcVar3 = ppVar19[1].second.m_data._M_dataplus._M_p;
  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(pcVar3 + -0x60);
  if (pcVar3 == (pointer)0x0) {
    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0;
  }
  ppVar6 = ppVar19;
  if (ppVar20 != ppVar19) {
    do {
      local_5a0 = ppVar6;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                 (allocator<char> *)&local_600);
      iVar7 = std::__cxx11::string::compare((char *)&local_668);
      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
      }
      if (iVar7 == 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pair(&local_348,ppVar20);
        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"name","");
        GetAttr(&local_600,&local_348,&local_550);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&local_348.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348.first._M_dataplus._M_p != &local_348.first.field_2) {
          operator_delete(local_348.first._M_dataplus._M_p,
                          local_348.first.field_2._M_allocated_capacity + 1);
        }
        lVar10 = std::__cxx11::string::find('\0',0x2e);
        if (lVar10 != -1) {
          std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_600);
          std::__cxx11::string::operator=((string *)&local_600,(string *)&local_668);
          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
            operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
          }
        }
        local_588 = *(undefined8 **)((long)(ppVar20->second).m_children + 8);
        puVar22 = (undefined8 *)(local_588[0xd] + -0x60);
        if (local_588[0xd] == 0) {
          puVar22 = (undefined8 *)0x0;
        }
        local_590 = ppVar20;
        if (puVar22 != local_588) {
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_668,(char *)*puVar22,(allocator<char> *)&local_5e0);
            iVar7 = std::__cxx11::string::compare((char *)&local_668);
            if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
              operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
            }
            if (iVar7 == 0) {
              local_668.startPos.x = (double)&local_668.endPos;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"<xmlattr>","");
              local_668.type._M_dataplus._M_p._0_1_ = 0x2e;
              local_668.type._M_string_length = (size_type)local_668.startPos.x;
              psVar11 = boost::property_tree::
                        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::get_child((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)(puVar22 + 4),(path_type *)&local_668);
              if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
              }
              local_580 = *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            **)((long)psVar11->m_children + 8);
              pcVar3 = local_580[1].second.m_data._M_dataplus._M_p;
              ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(pcVar3 + -0x60);
              if (pcVar3 == (pointer)0x0) {
                ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x0;
              }
              if (ppVar20 != local_580) {
                do {
                  p_Var23 = &local_3a0._M_impl.super__Rb_tree_header;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_668,(ppVar20->first)._M_dataplus._M_p,
                             (allocator<char> *)&local_5e0);
                  iVar7 = std::__cxx11::string::compare((char *)&local_668);
                  if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                    operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                  }
                  if (iVar7 == 0) {
                    pcVar3 = (ppVar20->second).m_data._M_dataplus._M_p;
                    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_5e0,pcVar3,
                               pcVar3 + (ppVar20->second).m_data._M_string_length);
                    lVar10 = std::__cxx11::string::find((char)&local_5e0,0x2e);
                    if (lVar10 != -1) {
                      std::__cxx11::string::substr((ulong)&local_668,(ulong)&local_5e0);
                      std::__cxx11::string::operator=((string *)&local_5e0,(string *)&local_668);
                      if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                        operator_delete((void *)local_668.startPos.x,(long)local_668.endPos.x + 1);
                      }
                    }
                    cVar15 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                             ::find(&local_3a0,&local_5e0);
                    if (((_Rb_tree_header *)cVar15._M_node != p_Var23) &&
                       (cVar15 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::find(&local_3a0,&local_600),
                       (_Rb_tree_header *)cVar15._M_node != p_Var23)) {
                      ppvVar14 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                               *)&local_3a0,&local_600);
                      this = (boost *)*ppvVar14;
                      ppvVar14 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                                               *)&local_3a0,&local_5e0);
                      sVar5 = local_5e0._M_string_length;
                      sVar4 = local_600._M_string_length;
                      u = *ppvVar14;
                      for (pbVar16 = *(boost **)this; pbVar16 != this; pbVar16 = *(boost **)pbVar16)
                      {
                        if (*(vertex_descriptor *)(pbVar16 + 0x10) == u) {
                          if (pbVar16 != this) goto LAB_0014e723;
                          break;
                        }
                      }
                      __n = local_5e0._M_string_length;
                      if (local_600._M_string_length < local_5e0._M_string_length) {
                        __n = local_600._M_string_length;
                      }
                      if (__n == 0) {
                        if (local_5e0._M_string_length != local_600._M_string_length)
                        goto LAB_0014e6cc;
                      }
                      else {
                        iVar7 = bcmp(local_5e0._M_dataplus._M_p,local_600._M_dataplus._M_p,__n);
                        if ((sVar5 != sVar4) || (iVar7 != 0)) {
LAB_0014e6cc:
                          local_668.startPos.y = 0.0;
                          local_668.endPos.x =
                               (double)((ulong)local_668.endPos.x & 0xffffffffffffff00);
                          local_668.startPos.x = (double)&local_668.endPos;
                          boost::
                          add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>
                                    ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>
                                      *)&local_578,this,u,&local_668,(edge_property_type *)local_598
                                     ,in_R9);
                          if ((Point2D *)local_668.startPos.x != &local_668.endPos) {
                            operator_delete((void *)local_668.startPos.x,
                                            (long)local_668.endPos.x + 1);
                          }
                        }
                      }
                    }
LAB_0014e723:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
                      operator_delete(local_5e0._M_dataplus._M_p,
                                      local_5e0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pcVar3 = ppVar20[1].second.m_data._M_dataplus._M_p;
                  ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(pcVar3 + -0x60);
                  if (pcVar3 == (pointer)0x0) {
                    ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)0x0;
                  }
                } while (ppVar20 != local_580);
              }
            }
            plVar2 = puVar22 + 0xd;
            puVar22 = (undefined8 *)(*plVar2 + -0x60);
            if (*plVar2 == 0) {
              puVar22 = (undefined8 *)0x0;
            }
          } while (puVar22 != local_588);
        }
        ppVar19 = local_5a0;
        ppVar20 = local_590;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
          ppVar19 = local_5a0;
          ppVar20 = local_590;
        }
      }
      pcVar3 = ppVar20[1].second.m_data._M_dataplus._M_p;
      ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(pcVar3 + -0x60);
      if (pcVar3 == (pointer)0x0) {
        ppVar20 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x0;
      }
      ppVar6 = local_5a0;
    } while (ppVar20 != ppVar19);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::~_Rb_tree(&local_3a0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_370);
  return local_5c0;
}

Assistant:

static graphProperties loadGraphFromXML(std::string filenamePath, floorplanGraph& outGraph, std::string rootNodeName){
        ptree XMLtree;
        read_xml(filenamePath, XMLtree);
        map<string, Vertex> nameToVertex;
        graphProperties currentGraphProperty;
        currentGraphProperty.filepath = filenamePath;

        size_t foundDot = filenamePath.find_last_of('/');
        if (foundDot != string::npos)
            currentGraphProperty.floorname = filenamePath.substr(foundDot+1, filenamePath.size()-1);
        else
            currentGraphProperty.floorname = filenamePath;

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string spaceName = GetAttr(v, "name");
                string spaceType = GetAttr(v, "type");

                size_t foundDot = spaceName.find_first_of('.');
                if (foundDot != string::npos)
                    spaceName = spaceName.substr(0, foundDot);


                if (!spaceName.empty()){
                    pair<bool,Vertex> searchResult =  GraphUtils::doesVertexExists(spaceName, outGraph);
                    Vertex currentVertex;
                    if (!searchResult.first){
                        currentVertex = add_vertex(outGraph);
                        outGraph[currentVertex].category  =  spaceType ;
                        outGraph[currentVertex].vertex_id =  spaceName;
                        nameToVertex[spaceName] = currentVertex;
                    }
                    else {

                        currentVertex = searchResult.second;
                    }
                    // For each space's children
                    BOOST_FOREACH(ptree::value_type &i,
                                  v.second)
                    {
                        if (((string)i.first.data()).compare("contour") == 0){
                            vector<Point2D> points;
                            BOOST_FOREACH(ptree::value_type &l,
                                          i.second)
                            {

                                char* endptr;
                                if( ((string)l.first.data()).compare("centroid") == 0 ){
                                    outGraph[currentVertex].centroid.x = strtod(GetAttr(l, "x").c_str(), &endptr);
                                    outGraph[currentVertex].centroid.y = strtod(GetAttr(l, "y").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("extent") == 0 ){

                                    outGraph[currentVertex].maxx = strtod(GetAttr(l, "maxx").c_str(), &endptr);
                                    outGraph[currentVertex].maxy = strtod(GetAttr(l, "maxy").c_str(), &endptr);
                                    outGraph[currentVertex].minx = strtod(GetAttr(l, "minx").c_str(), &endptr);
                                    outGraph[currentVertex].miny = strtod(GetAttr(l, "miny").c_str(), &endptr);
                                }
                                if( ((string)l.first.data()).compare("point") == 0 ){
                                    points.push_back(Point2D(strtod(GetAttr(l, "x").c_str(), &endptr), strtod(GetAttr(l, "y").c_str(), &endptr)));
                                }
                            } // for each contour children

                            if(points.size() > 0){
                                LineSegment lsegment;
                                for (int i=0; i < points.size(); i++){
                                    if(i == points.size()-1){
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[0];
                                    }
                                    else{
                                        lsegment.startPos = points[i];
                                        lsegment.endPos = points[i+1];
                                    }
                                    outGraph[currentVertex].roomLayout.push_back(lsegment);
                                }
                            }

                        } // if it's a contour

                    } // for each space children
                } // if space with an non-empty name
            } // if space
        }


        // now add edges

        BOOST_FOREACH(ptree::value_type &v, XMLtree.get_child(rootNodeName.c_str()))
        {
            if( ((string)v.first.data()).compare("space") == 0 )
            {
                string sourceSpaceName = GetAttr(v, "name");
                size_t foundDot = sourceSpaceName.find_first_of('.');
                if (foundDot != string::npos)
                    sourceSpaceName = sourceSpaceName.substr(0, foundDot);
                BOOST_FOREACH(ptree::value_type &i,
                              v.second)
                {
                    if( ((string)i.first.data()).compare("portal") == 0 )
                    {

                        BOOST_FOREACH(ptree::value_type &j,
                                      i.second.get_child("<xmlattr>"))
                        {
                            if( ((string)j.first.data()).compare("target") == 0 )
                            {
                                string targetSpaceName = (string)j.second.data();
                                size_t foundDot = targetSpaceName.find_first_of('.');
                                if (foundDot != string::npos)
                                    targetSpaceName = targetSpaceName.substr(0, foundDot);

                                if (nameToVertex.count(targetSpaceName) != 0 && nameToVertex.count(sourceSpaceName) !=  0) {
                                    Vertex v1 = nameToVertex[sourceSpaceName];
                                    Vertex v2 = nameToVertex[targetSpaceName];
                                    pair<Edge, bool> ret = boost::edge(v1, v2, outGraph);
                                    if (!ret.second && targetSpaceName.compare(sourceSpaceName) != 0){
                                        add_edge(v1, v2, outGraph);
                                    } // if edge does not already exists and target,source are not the same
                                } // if both target and source exists in the graph
                            } // if it's a target attribute
                        } // for each portal's attributes
                    } // if this is a portal

                } // for each element of space
            } // if this is a space
        } // Adding edges end

        return currentGraphProperty;
    }